

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O1

void __thiscall DbCheckPostLower::Check(DbCheckPostLower *this,RegOpnd *regOpnd)

{
  RegNum reg;
  IRType type;
  code *pcVar1;
  IRType IVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  Sym *pSVar6;
  char *message;
  char *error;
  uint lineNumber;
  
  if (regOpnd == (RegOpnd *)0x0) {
    return;
  }
  reg = regOpnd->m_reg;
  if (reg != RegNOREG) {
    IVar2 = LinearScan::GetRegType(reg);
    bVar3 = IRType_IsFloat(IVar2);
    IVar2 = (regOpnd->super_Opnd).m_type;
    if (bVar3) {
      bVar3 = IRType_IsFloat(IVar2);
      if ((!bVar3) && (bVar3 = IRType_IsSimd128((regOpnd->super_Opnd).m_type), !bVar3)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        error = "(IRType_IsFloat(regOpnd->GetType()) || IRType_IsSimd128(regOpnd->GetType()))";
        message = "IRType_IsFloat(regOpnd->GetType()) || IRType_IsSimd128(regOpnd->GetType())";
        lineNumber = 0x101;
LAB_0040870a:
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                           ,lineNumber,error,message);
        if (!bVar3) goto LAB_004088a8;
        *puVar5 = 0;
      }
    }
    else {
      bVar3 = IRType_IsNativeInt(IVar2);
      if ((!bVar3) && ((regOpnd->super_Opnd).m_type != TyVar)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                           ,0x105,
                           "(IRType_IsNativeInt(regOpnd->GetType()) || regOpnd->GetType() == TyVar)"
                           ,"IRType_IsNativeInt(regOpnd->GetType()) || regOpnd->GetType() == TyVar")
        ;
        if (!bVar3) goto LAB_004088a8;
        *puVar5 = 0;
      }
      if ((TySize[(regOpnd->super_Opnd).m_type] == 1) &&
         (bVar4 = LinearScan::GetRegAttribs(reg), (bVar4 & 8) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        error = "(LinearScan::GetRegAttribs(reg) & 0x8)";
        message = "LinearScan::GetRegAttribs(reg) & RA_BYTEABLE";
        lineNumber = 0x109;
        goto LAB_0040870a;
      }
    }
  }
  pSVar6 = IR::Opnd::GetSym(&regOpnd->super_Opnd);
  if (pSVar6 == (Sym *)0x0) {
    return;
  }
  pSVar6 = IR::Opnd::GetSym(&regOpnd->super_Opnd);
  if (pSVar6->m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) goto LAB_004088a8;
    *puVar5 = 0;
  }
  IVar2 = *(IRType *)((long)&pSVar6[1]._vptr_Sym + 4);
  type = (regOpnd->super_Opnd).m_type;
  bVar3 = IRType_IsSimd(IVar2);
  if (bVar3) {
    return;
  }
  bVar3 = IRType_IsNativeIntOrVar(IVar2);
  if (((!bVar3) || (bVar3 = IRType_IsNativeIntOrVar(type), !bVar3)) &&
     ((bVar3 = IRType_IsFloat(IVar2), !bVar3 || (bVar3 = IRType_IsFloat(type), !bVar3)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                       ,0x118,
                       "((IRType_IsNativeIntOrVar(tySym) && IRType_IsNativeIntOrVar(tyReg)) || (IRType_IsFloat(tySym) && IRType_IsFloat(tyReg)))"
                       ,
                       "(IRType_IsNativeIntOrVar(tySym) && IRType_IsNativeIntOrVar(tyReg)) || (IRType_IsFloat(tySym) && IRType_IsFloat(tyReg))"
                      );
    if (!bVar3) goto LAB_004088a8;
    *puVar5 = 0;
  }
  if ((TySize[IVar2] < TySize[type]) && ((this->func->field_0x242 & 0x40) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                       ,0x11a,"(TySize[tySym] >= TySize[tyReg] || this->func->isPostRegAlloc)",
                       "TySize[tySym] >= TySize[tyReg] || this->func->isPostRegAlloc");
    if (!bVar3) {
LAB_004088a8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void DbCheckPostLower::Check(IR::RegOpnd *regOpnd)
{
    if (regOpnd == NULL)
    {
        return;
    }

    RegNum reg = regOpnd->GetReg();
    if (reg != RegNOREG)
    {
        if (IRType_IsFloat(LinearScan::GetRegType(reg)))
        {
            // both simd128 and float64 map to float64 regs
            Assert(IRType_IsFloat(regOpnd->GetType()) || IRType_IsSimd128(regOpnd->GetType()));
        }
        else
        {
            Assert(IRType_IsNativeInt(regOpnd->GetType()) || regOpnd->GetType() == TyVar);
#if defined(_M_IX86) || defined(_M_X64)
            if (regOpnd->GetSize() == 1)
            {
                Assert(LinearScan::GetRegAttribs(reg) & RA_BYTEABLE);
            }
#endif
        }
    }

    if (regOpnd->GetSym())
    {
        StackSym *sym = regOpnd->GetSym()->AsStackSym();
        IRType tySym = sym->GetType();
        IRType tyReg = regOpnd->GetType();

        if (!IRType_IsSimd(tySym))
        {
            Assert((IRType_IsNativeIntOrVar(tySym) && IRType_IsNativeIntOrVar(tyReg))
                || (IRType_IsFloat(tySym) && IRType_IsFloat(tyReg)));

            Assert(TySize[tySym] >= TySize[tyReg] || this->func->isPostRegAlloc);
        }
    }
}